

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_support.c
# Opt level: O0

char * OSSL_EC_curve_nid2name(int nid)

{
  size_t i;
  int nid_local;
  
  if (0 < nid) {
    for (i = 0; i < 0x52; i = i + 1) {
      if (curve_list[i].nid == nid) {
        return curve_list[i].name;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *OSSL_EC_curve_nid2name(int nid)
{
    size_t i;

    if (nid <= 0)
        return NULL;

    for (i = 0; i < OSSL_NELEM(curve_list); i++) {
        if (curve_list[i].nid == nid)
            return curve_list[i].name;
    }
    return NULL;
}